

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
          (internal *this,char *expected_expression,char *actual_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  AssertionResult AVar3;
  string local_68;
  string local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          expected->_M_string_length;
  if (value == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               actual->_M_string_length) {
    if (value != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar1 = bcmp((expected->_M_dataplus)._M_p,(actual->_M_dataplus)._M_p,(size_t)value);
      value = extraout_RDX;
      if (iVar1 != 0) goto LAB_001be43d;
    }
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
LAB_001be43d:
    PrintToString<std::__cxx11::string>(&local_48,(testing *)expected,value);
    PrintToString<std::__cxx11::string>(&local_68,(testing *)actual,value_00);
    AVar3 = EqFailure(this,expected_expression,actual_expression,&local_48,&local_68,false);
    sVar2 = AVar3.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      sVar2.ptr_ = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      sVar2.ptr_ = extraout_RDX_01;
    }
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}